

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::TimeZoneFormat::parseZoneID
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UnicodeString *tzID)

{
  short sVar1;
  int32_t start;
  _func_int **srcChars;
  UBool UVar2;
  int iVar3;
  TextTrieMap *this_00;
  StringEnumeration *pSVar4;
  undefined4 extraout_var;
  UChar *key;
  undefined4 extraout_var_00;
  TextTrieMapSearchResultHandler *handler;
  int32_t length;
  code *size;
  UErrorCode status;
  UErrorCode local_34;
  UnicodeString *tzid;
  
  local_34 = U_ZERO_ERROR;
  size = (code *)text;
  if (gZoneIdTrieInitOnce != 2) {
    UVar2 = umtx_initImplPreInit((UInitOnce *)&gZoneIdTrieInitOnce);
    if (UVar2 != '\0') {
      size = tzfmt_cleanup;
      ucln_i18n_registerCleanup_63(UCLN_I18N_TIMEZONEFORMAT,tzfmt_cleanup);
      this_00 = (TextTrieMap *)UMemory::operator_new((UMemory *)0x38,(size_t)size);
      if (this_00 == (TextTrieMap *)0x0) {
        this_00 = (TextTrieMap *)0x0;
      }
      else {
        size = (code *)0x1;
        TextTrieMap::TextTrieMap(this_00,'\x01',(UObjectDeleter *)0x0);
      }
      gZoneIdTrie = this_00;
      if (this_00 == (TextTrieMap *)0x0) {
        local_34 = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        pSVar4 = TimeZone::createEnumeration();
        size = (code *)&stack0xffffffffffffffcc;
        iVar3 = (*(pSVar4->super_UObject)._vptr_UObject[7])(pSVar4);
        tzid = (UnicodeString *)CONCAT44(extraout_var,iVar3);
        if (tzid != (UnicodeString *)0x0) {
          do {
            key = ZoneMeta::findTimeZoneID(tzid);
            if (key != (UChar *)0x0) {
              TextTrieMap::put(gZoneIdTrie,key,key,&stack0xffffffffffffffcc);
            }
            size = (code *)&stack0xffffffffffffffcc;
            iVar3 = (*(pSVar4->super_UObject)._vptr_UObject[7])(pSVar4);
            tzid = (UnicodeString *)CONCAT44(extraout_var_00,iVar3);
          } while (tzid != (UnicodeString *)0x0);
        }
        (*(pSVar4->super_UObject)._vptr_UObject[1])(pSVar4);
      }
      DAT_003baa94 = local_34;
      umtx_initImplPostInit((UInitOnce *)&gZoneIdTrieInitOnce);
      goto LAB_001f7099;
    }
  }
  if (U_ZERO_ERROR < DAT_003baa94) {
    local_34 = DAT_003baa94;
  }
LAB_001f7099:
  start = pos->index;
  UnicodeString::setToBogus(tzID);
  iVar3 = 0;
  if (local_34 < U_ILLEGAL_ARGUMENT_ERROR) {
    handler = (TextTrieMapSearchResultHandler *)UMemory::operator_new((UMemory *)0x18,(size_t)size);
    if (handler == (TextTrieMapSearchResultHandler *)0x0) {
      handler = (TextTrieMapSearchResultHandler *)0x0;
    }
    else {
      handler->_vptr_TextTrieMapSearchResultHandler = (_func_int **)&PTR_handleMatch_003a6e48;
      *(undefined4 *)&handler[1]._vptr_TextTrieMapSearchResultHandler = 0;
      handler[2]._vptr_TextTrieMapSearchResultHandler = (_func_int **)0x0;
    }
    TextTrieMap::search(gZoneIdTrie,text,start,handler,&stack0xffffffffffffffcc);
    iVar3 = *(int *)&handler[1]._vptr_TextTrieMapSearchResultHandler;
    if (0 < iVar3) {
      srcChars = handler[2]._vptr_TextTrieMapSearchResultHandler;
      UnicodeString::unBogus(tzID);
      sVar1 = (tzID->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        length = (tzID->fUnion).fFields.fLength;
      }
      else {
        length = (int)sVar1 >> 5;
      }
      UnicodeString::doReplace(tzID,0,length,(UChar *)srcChars,0,-1);
    }
    if (handler != (TextTrieMapSearchResultHandler *)0x0) {
      (*handler->_vptr_TextTrieMapSearchResultHandler[2])(handler);
    }
  }
  if (iVar3 < 1) {
    pos->errorIndex = start;
  }
  else {
    pos->index = iVar3 + start;
  }
  return tzID;
}

Assistant:

UnicodeString&
TimeZoneFormat::parseZoneID(const UnicodeString& text, ParsePosition& pos, UnicodeString& tzID) const {
    UErrorCode status = U_ZERO_ERROR;
    umtx_initOnce(gZoneIdTrieInitOnce, &initZoneIdTrie, status);

    int32_t start = pos.getIndex();
    int32_t len = 0;
    tzID.setToBogus();

    if (U_SUCCESS(status)) {
        LocalPointer<ZoneIdMatchHandler> handler(new ZoneIdMatchHandler());
        gZoneIdTrie->search(text, start, handler.getAlias(), status); 
        len = handler->getMatchLen();
        if (len > 0) {
            tzID.setTo(handler->getID(), -1);
        }
    }

    if (len > 0) {
        pos.setIndex(start + len);
    } else {
        pos.setErrorIndex(start);
    }

    return tzID;
}